

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

void arm::display_reg_name(ostream *o,Reg r)

{
  uint uVar1;
  char *pcVar2;
  
  if (r == 0xf) {
    pcVar2 = "pc";
  }
  else if (r == 0xe) {
    pcVar2 = "lr";
  }
  else {
    if (r != 0xd) {
      uVar1 = 0;
      if ((((0xf < r) && (uVar1 = 1, 0x2f < r)) && (uVar1 = 2, 0x3f < r)) && (uVar1 = 3, (int)r < 0)
         ) {
        uVar1 = 5 - (r < 0xc0000000);
      }
      (*(code *)((long)&DAT_001bd34c + (long)(int)(&DAT_001bd34c)[uVar1]))();
      return;
    }
    pcVar2 = "sp";
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,2);
  return;
}

Assistant:

void display_reg_name(std::ostream &o, Reg r) {
  if (r == REG_SP)
    o << "sp";
  else if (r == REG_LR)
    o << "lr";
  else if (r == REG_PC)
    o << "pc";
  else
    switch (register_type(r)) {
      case RegisterKind::GeneralPurpose:
        o << "r" << register_num(r);
        break;
      case RegisterKind::DoubleVector:
        o << "d" << register_num(r);
        break;
      case RegisterKind::QuadVector:
        o << "q" << register_num(r);
        break;
      case RegisterKind::VirtualGeneralPurpose:
        o << "v" << register_num(r);
        break;
      case RegisterKind::VirtualDoubleVector:
        o << "vd" << register_num(r);
        break;
      case RegisterKind::VirtualQuadVector:
        o << "vq" << register_num(r);
        break;
    }
}